

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,int64_t size,float *copy)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  this->fStore = (float *)0x0;
  if (size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec<float>::TPZVec(const int64_t, const T &) [T = float]",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n",0x23);
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      pfVar1 = (float *)operator_new__(-(ulong)((ulong)size >> 0x3e != 0) | size * 4);
      this->fStore = pfVar1;
    }
    this->fNElements = size;
    this->fNAlloc = size;
    if (size != 0) {
      pfVar1 = this->fStore;
      lVar2 = 1;
      if (1 < size) {
        lVar2 = size;
      }
      lVar3 = 0;
      do {
        pfVar1[lVar3] = *copy;
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}